

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O0

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  boolean bVar10;
  short *psVar11;
  long *in_RSI;
  long *in_RDI;
  int pos;
  int look;
  int nb;
  int newnz_pos [64];
  int num_newnz;
  d_derived_tbl *tbl;
  bitread_working_state br_state;
  int bits_left;
  bit_buf_type get_buffer;
  JCOEFPTR thiscoef;
  JBLOCKROW block;
  uint EOBRUN;
  int r;
  int k;
  int s;
  int m1;
  int p1;
  int Se;
  phuff_entropy_ptr_conflict entropy;
  int in_stack_fffffffffffffe5c;
  uint in_stack_fffffffffffffe60;
  int iVar12;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  bit_buf_type in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  bit_buf_type in_stack_fffffffffffffe80;
  bitread_working_state *in_stack_fffffffffffffe88;
  int local_94;
  ulong local_78;
  int local_70;
  int local_5c;
  ulong local_58;
  int local_3c;
  int local_38;
  int local_34;
  uint local_30;
  boolean local_4;
  
  lVar2 = in_RDI[0x4a];
  iVar1 = (int)in_RDI[0x42];
  uVar8 = 1 << ((byte)(int)in_RDI[0x43] & 0x1f);
  uVar9 = -1 << ((byte)(int)in_RDI[0x43] & 0x1f);
  if ((((int)in_RDI[0x2e] == 0) || (*(int *)(lVar2 + 0x3c) != 0)) ||
     (bVar10 = process_restart((j_decompress_ptr)
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
     bVar10 != 0)) {
    if (*(int *)(lVar2 + 0x10) == 0) {
      uVar3 = *(undefined8 *)in_RDI[5];
      uVar4 = *(undefined8 *)(in_RDI[5] + 8);
      local_58 = *(ulong *)(lVar2 + 0x18);
      local_5c = *(int *)(lVar2 + 0x20);
      local_3c = *(int *)(lVar2 + 0x28);
      lVar5 = *in_RSI;
      lVar6 = *(long *)(lVar2 + 0x60);
      local_94 = 0;
      local_34 = *(int *)((long)in_RDI + 0x20c);
      sVar7 = (short)uVar9;
      if (local_3c == 0) {
        for (; local_34 <= iVar1; local_34 = local_34 + 1) {
          if (local_5c < 8) {
            bVar10 = jpeg_fill_bit_buffer
                               (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
            if (bVar10 == 0) goto LAB_00152826;
            local_58 = local_78;
            local_5c = local_70;
            if (7 < local_70) goto LAB_001521aa;
            iVar12 = 1;
LAB_00152222:
            local_30 = jpeg_huff_decode((bitread_working_state *)
                                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ),in_stack_fffffffffffffe70,
                                        in_stack_fffffffffffffe6c,
                                        (d_derived_tbl *)CONCAT44(iVar12,in_stack_fffffffffffffe60),
                                        in_stack_fffffffffffffe5c);
            if ((int)local_30 < 0) goto LAB_00152826;
            local_58 = local_78;
            local_5c = local_70;
          }
          else {
LAB_001521aa:
            in_stack_fffffffffffffe60 = (uint)(local_58 >> ((char)local_5c - 8U & 0x3f)) & 0xff;
            iVar12 = *(int *)(lVar6 + 0x128 + (long)(int)in_stack_fffffffffffffe60 * 4) >> 8;
            if (8 < iVar12) goto LAB_00152222;
            local_5c = local_5c - iVar12;
            local_30 = *(uint *)(lVar6 + 0x128 + (long)(int)in_stack_fffffffffffffe60 * 4) & 0xff;
          }
          local_38 = (int)local_30 >> 4;
          if ((local_30 & 0xf) == 0) {
            if (local_38 != 0xf) {
              local_3c = 1 << ((byte)local_38 & 0x1f);
              if (local_38 != 0) {
                if (local_5c < local_38) {
                  bVar10 = jpeg_fill_bit_buffer
                                     (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                      in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
                  if (bVar10 == 0) goto LAB_00152826;
                  local_58 = local_78;
                  local_5c = local_70;
                }
                local_5c = local_5c - local_38;
                local_3c = ((uint)(local_58 >> ((byte)local_5c & 0x3f)) &
                           (1 << ((byte)local_38 & 0x1f)) - 1U) + local_3c;
              }
              break;
            }
            local_30 = 0;
          }
          else {
            if ((local_30 & 0xf) != 1) {
              *(undefined4 *)(*in_RDI + 0x28) = 0x76;
              (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
            }
            if (local_5c < 1) {
              bVar10 = jpeg_fill_bit_buffer
                                 (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
              if (bVar10 == 0) goto LAB_00152826;
              local_58 = local_78;
              local_5c = local_70;
            }
            local_5c = local_5c + -1;
            local_30 = uVar9;
            if ((local_58 >> ((byte)local_5c & 0x3f) & 1) != 0) {
              local_30 = uVar8;
            }
          }
          do {
            psVar11 = (short *)(lVar5 + (long)jpeg_natural_order[local_34] * 2);
            if (*psVar11 == 0) {
              local_38 = local_38 + -1;
              if (local_38 < 0) break;
            }
            else {
              if (local_5c < 1) {
                bVar10 = jpeg_fill_bit_buffer
                                   (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                    in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
                if (bVar10 == 0) goto LAB_00152826;
                local_58 = local_78;
                local_5c = local_70;
              }
              local_5c = local_5c + -1;
              if (((local_58 >> ((byte)local_5c & 0x3f) & 1) != 0) && (((int)*psVar11 & uVar8) == 0)
                 ) {
                if (*psVar11 < 0) {
                  *psVar11 = *psVar11 + sVar7;
                }
                else {
                  *psVar11 = *psVar11 + (short)uVar8;
                }
              }
            }
            local_34 = local_34 + 1;
          } while (local_34 <= iVar1);
          if (local_30 != 0) {
            in_stack_fffffffffffffe5c = jpeg_natural_order[local_34];
            *(short *)(lVar5 + (long)in_stack_fffffffffffffe5c * 2) = (short)local_30;
            *(int *)(&stack0xfffffffffffffe68 + (long)local_94 * 4) = in_stack_fffffffffffffe5c;
            local_94 = local_94 + 1;
          }
        }
      }
      if (local_3c != 0) {
        for (; local_34 <= iVar1; local_34 = local_34 + 1) {
          psVar11 = (short *)(lVar5 + (long)jpeg_natural_order[local_34] * 2);
          if (*psVar11 != 0) {
            if (local_5c < 1) {
              bVar10 = jpeg_fill_bit_buffer
                                 (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
              if (bVar10 == 0) {
LAB_00152826:
                while (0 < local_94) {
                  local_94 = local_94 + -1;
                  *(undefined2 *)
                   (lVar5 + (long)*(int *)(&stack0xfffffffffffffe68 + (long)local_94 * 4) * 2) = 0;
                }
                return 0;
              }
              local_58 = local_78;
              local_5c = local_70;
            }
            local_5c = local_5c + -1;
            if (((local_58 >> ((byte)local_5c & 0x3f) & 1) != 0) && (((int)*psVar11 & uVar8) == 0))
            {
              if (*psVar11 < 0) {
                *psVar11 = *psVar11 + sVar7;
              }
              else {
                *psVar11 = *psVar11 + (short)uVar8;
              }
            }
          }
        }
        local_3c = local_3c + -1;
      }
      *(undefined8 *)in_RDI[5] = uVar3;
      *(undefined8 *)(in_RDI[5] + 8) = uVar4;
      *(ulong *)(lVar2 + 0x18) = local_58;
      *(int *)(lVar2 + 0x20) = local_5c;
      *(int *)(lVar2 + 0x28) = local_3c;
    }
    if ((int)in_RDI[0x2e] != 0) {
      *(int *)(lVar2 + 0x3c) = *(int *)(lVar2 + 0x3c) + -1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Se = cinfo->Se;
  int p1 = 1 << cinfo->Al;        /* 1 in the bit position being coded */
  int m1 = (NEG_1) << cinfo->Al;  /* -1 in the bit position being coded */
  register int s, k, r;
  unsigned int EOBRUN;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl *tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
        HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
        r = s >> 4;
        s &= 15;
        if (s) {
          if (s != 1)           /* size of new coef should always be 1 */
            WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
          CHECK_BIT_BUFFER(br_state, 1, goto undoit);
          if (GET_BITS(1))
            s = p1;             /* newly nonzero coef is positive */
          else
            s = m1;             /* newly nonzero coef is negative */
        } else {
          if (r != 15) {
            EOBRUN = 1 << r;    /* EOBr, run length is 2^r + appended bits */
            if (r) {
              CHECK_BIT_BUFFER(br_state, r, goto undoit);
              r = GET_BITS(r);
              EOBRUN += r;
            }
            break;              /* rest of block is handled by EOB logic */
          }
          /* note s = 0 for processing ZRL */
        }
        /* Advance over already-nonzero coefs and r still-zero coefs,
         * appending correction bits to the nonzeroes.  A correction bit is 1
         * if the absolute value of the coefficient must be increased.
         */
        do {
          thiscoef = *block + jpeg_natural_order[k];
          if (*thiscoef != 0) {
            CHECK_BIT_BUFFER(br_state, 1, goto undoit);
            if (GET_BITS(1)) {
              if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
                if (*thiscoef >= 0)
                  *thiscoef += p1;
                else
                  *thiscoef += m1;
              }
            }
          } else {
            if (--r < 0)
              break;            /* reached target zero coefficient */
          }
          k++;
        } while (k <= Se);
        if (s) {
          int pos = jpeg_natural_order[k];
          /* Output newly nonzero coefficient */
          (*block)[pos] = (JCOEF)s;
          /* Remember its position in case we have to suspend */
          newnz_pos[num_newnz++] = pos;
        }
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
        thiscoef = *block + jpeg_natural_order[k];
        if (*thiscoef != 0) {
          CHECK_BIT_BUFFER(br_state, 1, goto undoit);
          if (GET_BITS(1)) {
            if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
              if (*thiscoef >= 0)
                *thiscoef += p1;
              else
                *thiscoef += m1;
            }
          }
        }
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}